

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt slang::SVInt::concat(span<const_slang::SVInt,_18446744073709551615UL> operands)

{
  uint length;
  uint32_t length_00;
  byte bVar1;
  long lVar2;
  long in_RDX;
  SVInt *op;
  __extent_storage<18446744073709551615UL> _Var3;
  undefined8 extraout_RDX;
  uint64_t *puVar5;
  undefined8 extraout_RDX_00;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar6;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  uint32_t uVar7;
  __extent_storage<18446744073709551615UL> _Var8;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this;
  bitwidth_t bits;
  uint uVar9;
  long lVar10;
  SVInt SVar11;
  uint64_t val;
  uint64_t local_38;
  undefined8 uVar4;
  
  _Var8 = operands._M_extent._M_extent_value;
  this.val = (uint64_t)operands._M_ptr;
  if (in_RDX == 0) {
    SVInt((SVInt *)this.pVal,(SVIntStorage *)Zero);
    uVar4 = extraout_RDX;
  }
  else {
    lVar2 = in_RDX * 0x10;
    puVar5 = (uint64_t *)(_Var8._M_extent_value + lVar2);
    bVar1 = 0;
    bits = 0;
    _Var3._M_extent_value = _Var8._M_extent_value;
    for (; lVar2 != 0; lVar2 = lVar2 + -0x10) {
      bits = bits + *(int *)(_Var3._M_extent_value + 8);
      bVar1 = bVar1 & 1 | *(byte *)(_Var3._M_extent_value + 0xd);
      _Var3._M_extent_value = _Var3._M_extent_value + 0x10;
    }
    uVar9 = (bits + 0x3f >> 6) << (bVar1 & 1);
    if (bits == 0 || uVar9 == 1) {
      local_38 = 0;
      uVar7 = 0;
      for (lVar2 = in_RDX * -0x10; lVar2 != 0; lVar2 = lVar2 + 0x10) {
        bitcpy(&local_38,uVar7,puVar5 + -2,(uint32_t)puVar5[-1],0);
        uVar7 = uVar7 + (int)puVar5[-1];
        puVar5 = puVar5 + -2;
      }
      SVInt((SVInt *)this.pVal,bits,local_38,false);
      uVar4 = extraout_RDX_02;
    }
    else {
      uVar7 = 0;
      SVar11 = allocZeroed((SVInt *)this.pVal,bits,false,(bool)(bVar1 & 1));
      uVar4 = SVar11.super_SVIntStorage._8_8_;
      lVar10 = _Var8._M_extent_value - 0x10;
      for (lVar2 = in_RDX << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
        aVar6.val = this.val;
        if ((*(bool *)(this.val + 0xd) & 1U) != 0) {
          aVar6.val = *this.pVal;
        }
        if (0x40 < *(bitwidth_t *)(this.val + 8)) {
          aVar6.val = *this.pVal;
        }
        puVar5 = (uint64_t *)(lVar10 + lVar2);
        if ((*(byte *)((_Var8._M_extent_value - 3) + lVar2) & 1) != 0) {
          puVar5 = *(uint64_t **)(lVar10 + lVar2);
        }
        length = *(uint *)((_Var8._M_extent_value - 8) + lVar2);
        if (0x40 < length) {
          puVar5 = *(uint64_t **)(lVar10 + lVar2);
        }
        bitcpy(aVar6.pVal,uVar7,puVar5,length,0);
        uVar4 = extraout_RDX_00;
        if (*(char *)((_Var8._M_extent_value - 3) + lVar2) == '\x01') {
          aVar6.val = this.val;
          if ((*(bool *)(this.val + 0xd) & 1U) != 0) {
            aVar6.pVal = (uint64_t *)*this.pVal;
          }
          if (0x40 < *(bitwidth_t *)(this.val + 8)) {
            aVar6.pVal = (uint64_t *)*this.pVal;
          }
          length_00 = *(uint32_t *)((_Var8._M_extent_value - 8) + lVar2);
          bitcpy(aVar6.pVal + (uVar9 >> 1),uVar7,
                 (uint64_t *)((ulong)(length_00 + 0x3f >> 6) * 8 + *(long *)(lVar10 + lVar2)),
                 length_00,0);
          uVar4 = extraout_RDX_01;
        }
        uVar7 = uVar7 + *(int *)((_Var8._M_extent_value - 8) + lVar2);
      }
    }
  }
  SVar11.super_SVIntStorage.bitWidth = (int)uVar4;
  SVar11.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar4 >> 0x20);
  SVar11.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar4 >> 0x28);
  SVar11.super_SVIntStorage._14_2_ = (short)((ulong)uVar4 >> 0x30);
  SVar11.super_SVIntStorage.field_0.pVal = (uint64_t *)this.val;
  return (SVInt)SVar11.super_SVIntStorage;
}

Assistant:

SVInt SVInt::concat(std::span<SVInt const> operands) {
    // 0 operand concatenations can be valid inside of larger concatenations.
    if (operands.size() == 0)
        return SVInt::Zero;

    // First, compute how many bits total we are dealing with.
    bitwidth_t bits = 0;
    bool isUnknown = false;
    for (const auto& op : operands) {
        bits += op.bitWidth;
        isUnknown |= op.unknownFlag;
    }

    uint32_t words = SVInt::getNumWords(bits, isUnknown);
    if (words == 1 || bits == 0) {
        // The concatenation still fits into a single word.
        bitwidth_t offset = 0;
        uint64_t val = 0;

        // The first operand writes the msb, so operate in reverse.
        for (auto it = operands.rbegin(); it != operands.rend(); it++) {
            bitcpy(&val, offset, &it->val, it->bitWidth);
            offset += it->bitWidth;
        }
        return SVInt(bits, val, false);
    }

    // Result data is zeroed out, which is the proper default, so it doesn't
    // matter that we may not write to certain unknown words or might not
    // write all the way to the end.
    SVInt result = SVInt::allocZeroed(bits, false, isUnknown);

    bitwidth_t offset = 0;
    for (auto it = operands.rbegin(); it != operands.rend(); it++) {
        bitcpy(result.getRawData(), offset, it->getRawData(), it->bitWidth);
        if (it->unknownFlag) {
            bitcpy(result.getRawData() + words / 2, offset, it->pVal + it->getNumWords() / 2,
                   it->bitWidth);
        }
        offset += it->bitWidth;
    }

    return result;
}